

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O0

void floaxie::grisu2<_19,_16,float,char>(float v,char *buffer,int *length,int *K)

{
  exponent_storage_type e;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_68;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *local_60;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *c_mk;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *pdStack_50;
  int mk;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *w_p;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *w_m;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_38;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *local_30;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  *w;
  int *K_local;
  int *length_local;
  char *buffer_local;
  float v_local;
  
  w = (pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
       *)K;
  K_local = length;
  length_local = (int *)buffer;
  buffer_local._4_4_ = v;
  _w_m = diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(v);
  w_p = (diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&w_m;
  pdStack_50 = &local_38;
  local_30 = w_p;
  e = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent(pdStack_50);
  c_mk._4_4_ = k_comp_exp<_19,_16>(e);
  local_68 = cached_power<float>(c_mk._4_4_);
  local_60 = &local_68;
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator*=(w_p,local_60);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator*=(pdStack_50,local_60);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator++(w_p);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator--(pdStack_50);
  (w->first).m_f = -c_mk._4_4_;
  digit_gen<_19,_16,float,char>(pdStack_50,w_p,(char *)length_local,K_local,(int *)w);
  return;
}

Assistant:

inline void grisu2(FloatType v, CharType* buffer, int* length, int* K) noexcept
	{
		static_assert(alpha <= gamma - 3,
			"It's imposed that γ ⩾ α + 3, since otherwise it's not always possible to find a proper decimal cached power");

		std::pair<diy_fp<FloatType>, diy_fp<FloatType>>&& w(diy_fp<FloatType>::boundaries(v));
		diy_fp<FloatType> &w_m(w.first), &w_p(w.second);

		const int mk = k_comp_exp<alpha, gamma>(w_p.exponent());
		const diy_fp<FloatType>& c_mk(cached_power<FloatType>(mk));

		w_m *= c_mk;
		w_p *= c_mk;

		++w_m;
		--w_p;

		*K = -mk;

		digit_gen<alpha, gamma>(w_p, w_m, buffer, length, K);
	}